

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

bool __thiscall Js::PathTypeHandlerBase::HasAnyFixedProperties(PathTypeHandlerBase *this)

{
  ushort uVar1;
  PropertyIndex PVar2;
  bool bVar3;
  PropertyIndex index;
  
  uVar1 = (this->super_DynamicTypeHandler).unusedBytes >> 1;
  PVar2 = 0;
  do {
    index = PVar2;
    if (uVar1 == index) break;
    bVar3 = TypePath::GetIsFixedFieldAt((this->typePath).ptr,index,(uint)uVar1);
    PVar2 = index + 1;
  } while (!bVar3);
  return index < uVar1;
}

Assistant:

bool PathTypeHandlerBase::HasAnyFixedProperties() const
    {
        int pathLength = GetPathLength();
        for (PropertyIndex i = 0; i < pathLength; i++)
        {
            if (this->GetTypePath()->GetIsFixedFieldAt(i, pathLength))
            {
                return true;
            }
        }
        return false;
    }